

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphStatistics.cpp
# Opt level: O3

void __thiscall floorplan::GraphStatistics::calculateAverageClusterCoeffient(GraphStatistics *this)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  ulong uVar5;
  size_type *psVar6;
  ulong uVar7;
  long lVar8;
  pointer paVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  stringstream strs;
  long *local_218 [2];
  long local_208 [2];
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  float local_1a8;
  ios_base aiStack_138 [264];
  
  this->_averageClusterCoefficient = 0.0;
  paVar9 = (this->_database->_graphs).
           super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = 0;
  if ((this->_database->_graphs).
      super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == paVar9) {
    uVar5 = 0;
    uVar12 = 0;
    uVar13 = 0;
  }
  else {
    iVar2 = 0;
    lVar8 = 0;
    uVar7 = 0;
    do {
      GraphUtils::calculateClusterCoeff
                ((pair<boost::container_property_map<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_weight_t,_int,_boost::no_property>,_boost::no_property,_boost::listS>,_unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_float>
                  *)local_1b8,
                 (floorplanGraph *)
                 ((long)&(paVar9->super_type).m_edges.
                         super__List_base<boost::list_edge<void_*,_spaceEdge>,_std::allocator<boost::list_edge<void_*,_spaceEdge>_>_>
                         ._M_impl._M_node.super__List_node_base + lVar8));
      if (NAN(local_1a8)) {
        iVar2 = iVar2 + 1;
      }
      else {
        dVar1 = (double)local_1a8;
        if ((dVar1 <= 0.4) ||
           (*(ulong *)((long)&((this->_database->_graphs).
                               super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->super_type + lVar8 + 0x28
                      ) < 0x15)) {
          if ((local_1a8 == 0.0) &&
             ((!NAN(local_1a8) &&
              (0x14 < *(ulong *)((long)&((this->_database->_graphs).
                                         super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->super_type +
                                lVar8 + 0x28))))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Low!",4);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
            std::ostream::put(-0x48);
            std::ostream::flush();
            poVar3 = std::ostream::_M_insert<double>(dVar1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::ostream::operator<<((ostream *)&local_1a8,(int)uVar7);
            std::__cxx11::stringbuf::str();
            plVar4 = (long *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x15f228);
            psVar6 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_1f8.field_2._M_allocated_capacity = *psVar6;
              local_1f8.field_2._8_8_ = plVar4[3];
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            }
            else {
              local_1f8.field_2._M_allocated_capacity = *psVar6;
              local_1f8._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_1f8._M_string_length = plVar4[1];
            *plVar4 = (long)psVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            GraphFileOperations::saveGraphToPNG
                      (&local_1f8,
                       (floorplanGraph *)
                       ((long)&((this->_database->_graphs).
                                super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_type + lVar8));
            uVar10 = local_1f8.field_2._M_allocated_capacity;
            _Var11._M_p = local_1f8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) goto LAB_001426e9;
            goto LAB_001426f1;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"High!",5);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
          std::ostream::put(-0x48);
          std::ostream::flush();
          poVar3 = std::ostream::_M_insert<double>(dVar1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::ostream::operator<<((ostream *)&local_1a8,(int)uVar7);
          std::__cxx11::stringbuf::str();
          plVar4 = (long *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x15f21d);
          psVar6 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_1d8.field_2._M_allocated_capacity = *psVar6;
            local_1d8.field_2._8_8_ = plVar4[3];
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          }
          else {
            local_1d8.field_2._M_allocated_capacity = *psVar6;
            local_1d8._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_1d8._M_string_length = plVar4[1];
          *plVar4 = (long)psVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          GraphFileOperations::saveGraphToPNG
                    (&local_1d8,
                     (floorplanGraph *)
                     ((long)&((this->_database->_graphs).
                              super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->super_type + lVar8));
          uVar10 = local_1d8.field_2._M_allocated_capacity;
          _Var11._M_p = local_1d8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
LAB_001426e9:
            operator_delete(_Var11._M_p,uVar10 + 1);
          }
LAB_001426f1:
          if (local_218[0] != local_208) {
            operator_delete(local_218[0],local_208[0] + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(aiStack_138);
        }
        this->_averageClusterCoefficient = this->_averageClusterCoefficient + dVar1;
        poVar3 = std::ostream::_M_insert<double>(dVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," total ",7);
        poVar3 = std::ostream::_M_insert<double>(this->_averageClusterCoefficient);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      uVar7 = uVar7 + 1;
      paVar9 = (this->_database->_graphs).
               super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->_database->_graphs).
                     super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar9 >> 3) *
              0x6db6db6db6db6db7;
      lVar8 = lVar8 + 0x38;
    } while (uVar7 <= uVar5 && uVar5 - uVar7 != 0);
    uVar12 = SUB84(this->_averageClusterCoefficient,0);
    uVar13 = (undefined4)((ulong)this->_averageClusterCoefficient >> 0x20);
    lVar8 = (long)iVar2;
  }
  lVar8 = uVar5 - lVar8;
  auVar14._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar14._0_8_ = lVar8;
  auVar14._12_4_ = 0x45300000;
  this->_averageClusterCoefficient =
       (double)CONCAT44(uVar13,uVar12) /
       ((auVar14._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
  return;
}

Assistant:

void GraphStatistics::calculateAverageClusterCoeffient()//ExportClusterCoeffDistForCategory(string sFilename, string sCategory)
{
    _averageClusterCoefficient = 0.0;
    int nanvalues = 0;

    for(int i=0; i < _database->getGraphs().size(); i++)
    {
        std::pair<ClusteringMap, double> kRes = GraphUtils::calculateClusterCoeff(_database->getGraphs()[i]);
        if (isnan(kRes.second)){
        nanvalues++;
            continue;
        }
        if( kRes.second > 0.4 && num_vertices(_database->getGraphs()[i]) > 20 )
        {
            cout << "High!" << endl;
            cout << kRes.second << endl;
            stringstream strs;
            strs << i;
            GraphFileOperations::saveGraphToPNG("high_" + strs.str(), _database->getGraphs()[i]);
        }
        else if( kRes.second == 0 && num_vertices(_database->getGraphs()[i]) > 20 )
        {
            cout << "Low!" << endl;
            cout << kRes.second << endl;
            if(kRes.second == 0){
                stringstream strs;
                strs << i;
                GraphFileOperations::saveGraphToPNG("low_" + strs.str(), _database->getGraphs()[i]);

            }

        }

        _averageClusterCoefficient += kRes.second;
        cout << kRes.second << " total " << _averageClusterCoefficient << endl;
    }
    _averageClusterCoefficient = _averageClusterCoefficient /  ( _database->getGraphs().size() - nanvalues);
}